

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O1

err_t cmdSigVerify(char *name,char *sig_name,octet *pubkey,size_t pubkey_len)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  octet *poVar4;
  cmd_sig_t *pcVar5;
  bool_t bVar6;
  err_t eVar7;
  cmd_sig_t *sig;
  size_t sVar8;
  char *oid;
  bign_params *params;
  octet *poVar9;
  size_t oid_len;
  size_t drop;
  size_t cert_len;
  size_t offset;
  size_t local_88;
  octet *local_80;
  octet *local_78;
  octet *local_70;
  size_t local_68;
  octet *local_60;
  octet *local_58;
  ulong local_50;
  cmd_sig_t *local_48;
  size_t local_40;
  size_t local_38;
  
  local_88 = 0x10;
  bVar6 = strIsValid(name);
  if (bVar6 == 0) {
    return 0x6d;
  }
  bVar6 = strIsValid(sig_name);
  if (bVar6 == 0) {
    return 0x6d;
  }
  uVar1 = pubkey_len - 0x30 >> 4;
  if (5 < (pubkey_len << 0x3c | uVar1)) {
    return 0x6d;
  }
  if ((0x2bUL >> (uVar1 & 0x3f) & 1) == 0) {
    return 0x6d;
  }
  bVar6 = memIsValid(pubkey,pubkey_len);
  if (bVar6 == 0) {
    return 0x6d;
  }
  sig = (cmd_sig_t *)blobCreate((pubkey_len >> 1) + local_88 + 0x8a8);
  if (sig == (cmd_sig_t *)0x0) {
    return 0x6e;
  }
  poVar9 = sig[1].certs + 0x210 + local_88;
  local_70 = pubkey;
  local_50 = pubkey_len >> 1;
  local_48 = sig;
  eVar7 = cmdSigRead(sig,&local_68,sig_name);
  if (eVar7 != 0) goto LAB_00106d51;
  local_80 = sig[1].certs + 0x210;
  local_78 = poVar9;
  bVar6 = cmdFileAreSame(name,sig_name);
  sVar3 = local_68;
  if (bVar6 == 0) {
    sVar8 = cmdFileSize(sig_name);
    eVar7 = 0x132;
    if (sVar3 != sVar8) goto LAB_00106d51;
    local_68 = 0;
  }
  pcVar5 = local_48;
  local_60 = local_48->certs;
  poVar9 = local_48->date;
  eVar7 = cmdCVCsVal(local_60,sig->certs_len,poVar9);
  poVar4 = local_60;
  if (eVar7 != 0) goto LAB_00106d51;
  local_58 = poVar9;
  if (sig->certs_len != 0) {
    eVar7 = cmdCVCsGetLast(&local_38,&local_40,local_60,sig->certs_len);
    if ((eVar7 == 0) &&
       (eVar7 = btokCVCUnwrap((btok_cvc_t *)(pcVar5 + 1),poVar4 + local_38,local_40,(octet *)0x0,0),
       eVar7 == 0)) {
      if ((*(size_t *)(sig[1].certs + 0x38) == pubkey_len) &&
         (bVar6 = memEq(local_70,pcVar5[1].sig + 0x1a,pubkey_len), bVar6 != 0)) {
        eVar7 = 0;
        bVar2 = true;
      }
      else {
        eVar7 = 0x1f9;
        bVar2 = false;
      }
      if (!bVar2) goto LAB_00106dbd;
      bVar2 = true;
    }
    else {
LAB_00106dbd:
      blobClose(sig);
      bVar2 = false;
    }
    if (!bVar2) {
      return eVar7;
    }
  }
  uVar1 = local_50;
  params = (bign_params *)(pcVar5[1].certs + 0xc0);
  eVar7 = cmdSigParamsStd(params,local_50);
  if ((eVar7 == 0) &&
     (eVar7 = cmdSigHash(local_78,uVar1,name,local_68,local_60,sig->certs_len,local_58), eVar7 == 0)
     ) {
    if (pubkey_len < 0x41) {
      oid = "1.2.112.0.2.0.34.101.31.81";
    }
    else {
      oid = "1.2.112.0.2.0.34.101.77.13";
      if (pubkey_len == 0x60) {
        oid = "1.2.112.0.2.0.34.101.77.12";
      }
    }
    eVar7 = bignOidToDER(local_80,&local_88,oid);
    poVar9 = local_70;
    if (eVar7 == 0) {
      if (pubkey_len == 0x30) {
        eVar7 = bign96PubkeyVal(params,local_70);
      }
      else {
        eVar7 = bignPubkeyVal(params,local_70);
      }
      if (eVar7 == 0) {
        if (pubkey_len == 0x30) {
          eVar7 = bign96Verify(params,local_80,local_88,local_78,(octet *)sig,poVar9);
        }
        else {
          eVar7 = bignVerify(params,local_80,local_88,local_78,(octet *)sig,poVar9);
        }
      }
    }
  }
LAB_00106d51:
  blobClose(sig);
  return eVar7;
}

Assistant:

err_t cmdSigVerify(const char* name, const char* sig_name,
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	btok_cvc_t* cvc;
	bign_params* params;
	octet* oid_der;
	size_t oid_len = 16;
	octet* hash;
	size_t drop;
	// входной контроль
	if (!strIsValid(name) || !strIsValid(sig_name) ||
		!(pubkey_len == 48 || pubkey_len == 64 || pubkey_len == 96 || 
			pubkey_len == 128) ||
		!memIsValid(pubkey, pubkey_len))
		return ERR_BAD_INPUT;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t) + sizeof(btok_cvc_t) +
		sizeof(bign_params) + oid_len + pubkey_len / 2);
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	cvc = (btok_cvc_t*)(sig + 1);
	params = (bign_params*)(cvc + 1);
	oid_der = (octet*)(params + 1);
	hash = oid_der + oid_len;
	// читать подпись
	code = cmdSigRead(sig, &drop, sig_name);	
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// подпись в отдельном файле?
	if (!cmdFileAreSame(name, sig_name))
	{
		code = drop == cmdFileSize(sig_name) ? ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		drop = 0;
	}
	// проверить сертификаты
	code = cmdCVCsVal(sig->certs, sig->certs_len, sig->date);	
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// есть сертификаты?
	if (sig->certs_len)
	{
		size_t offset;
		size_t cert_len;
		// найти и разобрать последний сертификат
		code = cmdCVCsGetLast(&offset, &cert_len, sig->certs, sig->certs_len);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		code = btokCVCUnwrap(cvc, sig->certs + offset, cert_len, 0, 0);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить открытый ключ последнего сертификата
		if (pubkey_len != cvc->pubkey_len ||
			!memEq(pubkey, cvc->pubkey, pubkey_len))
			code = ERR_BAD_PUBKEY;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	// загрузить долговременные параметры
	code = cmdSigParamsStd(params, pubkey_len / 2);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать
	code = cmdSigHash(hash, pubkey_len / 2, name, drop, sig->certs, 
		sig->certs_len, sig->date);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	if (pubkey_len <= 64)
	{
		code = bignOidToDER(oid_der, &oid_len, "1.2.112.0.2.0.34.101.31.81");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	else 
	{
		code = bignOidToDER(oid_der, &oid_len, pubkey_len == 96 ? 
			"1.2.112.0.2.0.34.101.77.12" : "1.2.112.0.2.0.34.101.77.13");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	// проверить открытый ключ
	if (pubkey_len == 48)
		code = bign96PubkeyVal(params, pubkey);
	else
		code = bignPubkeyVal(params, pubkey);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить подпись
	if (pubkey_len == 48)
		code = bign96Verify(params, oid_der, oid_len, hash, sig->sig, pubkey);
	else
		code = bignVerify(params, oid_der, oid_len, hash, sig->sig, pubkey);
	// завершить
	cmdBlobClose(stack);
	return code;
}